

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O0

void __thiscall QUrlQuery::QUrlQuery(QUrlQuery *this,QString *queryString)

{
  bool bVar1;
  QUrlQueryPrivate *in_RSI;
  QUrlQueryPrivate *in_stack_ffffffffffffffb8;
  QUrlQueryPrivate *this_00;
  
  bVar1 = QString::isEmpty((QString *)0x313a66);
  if (bVar1) {
    this_00 = (QUrlQueryPrivate *)0x0;
  }
  else {
    in_stack_ffffffffffffffb8 = (QUrlQueryPrivate *)operator_new(0x28);
    QUrlQueryPrivate::QUrlQueryPrivate(in_RSI,(QString *)in_stack_ffffffffffffffb8);
    this_00 = in_stack_ffffffffffffffb8;
  }
  QSharedDataPointer<QUrlQueryPrivate>::QSharedDataPointer
            ((QSharedDataPointer<QUrlQueryPrivate> *)this_00,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

QUrlQuery::QUrlQuery(const QString &queryString)
    : d(queryString.isEmpty() ? nullptr : new QUrlQueryPrivate(queryString))
{
}